

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O0

void Gia_WriteDotAigSimple(Gia_Man_t *p,char *pFileName,Vec_Int_t *vBold)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  uint local_40;
  int fConstIsUsed;
  int i;
  int Level;
  int Prev;
  int LevelMax;
  Gia_Obj_t *pNode;
  FILE *pFile;
  Vec_Int_t *vBold_local;
  char *pFileName_local;
  Gia_Man_t *p_local;
  
  bVar7 = false;
  iVar1 = Gia_ManAndNum(p);
  if (iVar1 < 0x7d1) {
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
    }
    else {
      if (vBold == (Vec_Int_t *)0x0) {
        if ((p->nXors != 0) || (p->nMuxes != 0)) {
          local_40 = 0;
          while( true ) {
            bVar6 = false;
            if ((int)local_40 < p->nObjs) {
              _Prev = Gia_ManObj(p,local_40);
              bVar6 = _Prev != (Gia_Obj_t *)0x0;
            }
            if (!bVar6) break;
            iVar1 = Gia_ObjIsXor(_Prev);
            if ((iVar1 != 0) || (iVar1 = Gia_ObjIsMux(p,_Prev), iVar1 != 0)) {
              *(ulong *)_Prev = *(ulong *)_Prev & 0xffffffffbfffffff | 0x40000000;
            }
            local_40 = local_40 + 1;
          }
        }
      }
      else {
        local_40 = 0;
        while( true ) {
          iVar1 = Vec_IntSize(vBold);
          bVar6 = false;
          if ((int)local_40 < iVar1) {
            iVar1 = Vec_IntEntry(vBold,local_40);
            _Prev = Gia_ManObj(p,iVar1);
            bVar6 = _Prev != (Gia_Obj_t *)0x0;
          }
          if (!bVar6) break;
          *(ulong *)_Prev = *(ulong *)_Prev & 0xffffffffbfffffff | 0x40000000;
          local_40 = local_40 + 1;
        }
      }
      uVar2 = Gia_ManLevelNum(p);
      uVar3 = uVar2 + 1;
      local_40 = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar6 = false;
        if ((int)local_40 < iVar1) {
          _Prev = Gia_ManCo(p,local_40);
          bVar6 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        p_00 = p->vLevels;
        iVar1 = Gia_ObjId(p,_Prev);
        Vec_IntWriteEntry(p_00,iVar1,uVar3);
        local_40 = local_40 + 1;
      }
      fprintf(__stream,"# %s\n","AIG structure generated by GIA package");
      fprintf(__stream,"\n");
      fprintf(__stream,"digraph AIG {\n");
      fprintf(__stream,"size = \"7.5,10\";\n");
      fprintf(__stream,"center = true;\n");
      fprintf(__stream,"edge [dir = back];\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  node [shape = plaintext];\n");
      fprintf(__stream,"  edge [style = invis];\n");
      fprintf(__stream,"  LevelTitle1 [label=\"\"];\n");
      fprintf(__stream,"  LevelTitle2 [label=\"\"];\n");
      for (fConstIsUsed = uVar3; -1 < fConstIsUsed; fConstIsUsed = fConstIsUsed + -1) {
        fprintf(__stream,"  Level%d",(ulong)(uint)fConstIsUsed);
        fprintf(__stream," [label = ");
        fprintf(__stream,"\"");
        fprintf(__stream,"\"");
        fprintf(__stream,"];\n");
      }
      fprintf(__stream,"  LevelTitle1 ->  LevelTitle2 ->");
      for (fConstIsUsed = uVar3; -1 < fConstIsUsed; fConstIsUsed = fConstIsUsed + -1) {
        fprintf(__stream,"  Level%d",(ulong)(uint)fConstIsUsed);
        if (fConstIsUsed == 0) {
          fprintf(__stream,";");
        }
        else {
          fprintf(__stream," ->");
        }
      }
      fprintf(__stream,"\n");
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  LevelTitle1;\n");
      fprintf(__stream,"  title1 [shape=plaintext,\n");
      fprintf(__stream,"          fontsize=20,\n");
      fprintf(__stream,"          fontname = \"Times-Roman\",\n");
      fprintf(__stream,"          label=\"");
      fprintf(__stream,"%s","AIG structure visualized by ABC");
      fprintf(__stream,"\\n");
      fprintf(__stream,"Benchmark \\\"%s\\\". ","aig");
      fprintf(__stream,"\"\n");
      fprintf(__stream,"         ];\n");
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  LevelTitle2;\n");
      fprintf(__stream,"  title2 [shape=plaintext,\n");
      fprintf(__stream,"          fontsize=18,\n");
      fprintf(__stream,"          fontname = \"Times-Roman\",\n");
      fprintf(__stream,"          label=\"");
      uVar4 = Gia_ManAndNum(p);
      fprintf(__stream,"The AIG contains %d nodes and spans %d levels.",(ulong)uVar4,(ulong)uVar2);
      fprintf(__stream,"\\n");
      fprintf(__stream,"\"\n");
      fprintf(__stream,"         ];\n");
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  Level%d;\n",(ulong)uVar3);
      local_40 = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar6 = false;
        if ((int)local_40 < iVar1) {
          _Prev = Gia_ManCo(p,local_40);
          bVar6 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        iVar1 = Gia_ObjFaninId0p(p,_Prev);
        if (iVar1 == 0) {
          bVar7 = true;
        }
        uVar3 = Gia_ObjId(p,_Prev);
        uVar4 = Gia_ObjId(p,_Prev);
        fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar3,(ulong)uVar4);
        fprintf(__stream,", shape = %s","invtriangle");
        fprintf(__stream,", color = coral, fillcolor = coral");
        fprintf(__stream,"];\n");
        local_40 = local_40 + 1;
      }
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      for (fConstIsUsed = uVar2; 0 < fConstIsUsed; fConstIsUsed = fConstIsUsed + -1) {
        fprintf(__stream,"{\n");
        fprintf(__stream,"  rank = same;\n");
        fprintf(__stream,"  Level%d;\n",(ulong)(uint)fConstIsUsed);
        local_40 = 0;
        while( true ) {
          bVar6 = false;
          if ((int)local_40 < p->nObjs) {
            _Prev = Gia_ManObj(p,local_40);
            bVar6 = _Prev != (Gia_Obj_t *)0x0;
          }
          if (!bVar6) break;
          iVar1 = Gia_ObjLevel(p,_Prev);
          if (iVar1 == fConstIsUsed) {
            fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)local_40,(ulong)local_40);
            iVar1 = Gia_ObjIsXor(_Prev);
            if (iVar1 == 0) {
              iVar1 = Gia_ObjIsMux(p,_Prev);
              if (iVar1 == 0) {
                fprintf(__stream,", shape = ellipse");
              }
              else {
                fprintf(__stream,", shape = trapezium");
              }
            }
            else {
              fprintf(__stream,", shape = doublecircle");
            }
            if ((*(ulong *)_Prev >> 0x1e & 1) != 0) {
              fprintf(__stream,", style = filled");
            }
            fprintf(__stream,"];\n");
          }
          local_40 = local_40 + 1;
        }
        fprintf(__stream,"}");
        fprintf(__stream,"\n");
        fprintf(__stream,"\n");
      }
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  Level%d;\n",0);
      if (bVar7) {
        fprintf(__stream,"  Node%d [label = \"Const0\"",0);
        fprintf(__stream,", shape = ellipse");
        fprintf(__stream,", color = coral, fillcolor = coral");
        fprintf(__stream,"];\n");
      }
      local_40 = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCis);
        bVar7 = false;
        if ((int)local_40 < iVar1) {
          _Prev = Gia_ManCi(p,local_40);
          bVar7 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        uVar2 = Gia_ObjId(p,_Prev);
        uVar3 = Gia_ObjId(p,_Prev);
        fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar2,(ulong)uVar3);
        fprintf(__stream,", shape = %s","triangle");
        fprintf(__stream,", color = coral, fillcolor = coral");
        fprintf(__stream,"];\n");
        local_40 = local_40 + 1;
      }
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"title1 -> title2 [style = invis];\n");
      local_40 = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar7 = false;
        if ((int)local_40 < iVar1) {
          _Prev = Gia_ManCo(p,local_40);
          bVar7 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        uVar2 = Gia_ObjId(p,_Prev);
        fprintf(__stream,"title2 -> Node%d [style = invis];\n",(ulong)uVar2);
        local_40 = local_40 + 1;
      }
      i = -1;
      local_40 = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar7 = false;
        if ((int)local_40 < iVar1) {
          _Prev = Gia_ManCo(p,local_40);
          bVar7 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        if (0 < (int)local_40) {
          uVar2 = Gia_ObjId(p,_Prev);
          fprintf(__stream,"Node%d -> Node%d [style = invis];\n",(ulong)(uint)i,(ulong)uVar2);
        }
        i = Gia_ObjId(p,_Prev);
        local_40 = local_40 + 1;
      }
      i = -1;
      local_40 = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCis);
        bVar7 = false;
        if ((int)local_40 < iVar1) {
          _Prev = Gia_ManCi(p,local_40);
          bVar7 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        if (0 < (int)local_40) {
          uVar2 = Gia_ObjId(p,_Prev);
          fprintf(__stream,"Node%d -> Node%d [style = invis];\n",(ulong)(uint)i,(ulong)uVar2);
        }
        i = Gia_ObjId(p,_Prev);
        local_40 = local_40 + 1;
      }
      local_40 = 0;
      while( true ) {
        bVar7 = false;
        if ((int)local_40 < p->nObjs) {
          _Prev = Gia_ManObj(p,local_40);
          bVar7 = _Prev != (Gia_Obj_t *)0x0;
        }
        if (!bVar7) break;
        iVar1 = Gia_ObjIsAnd(_Prev);
        if (((iVar1 != 0) || (iVar1 = Gia_ObjIsCo(_Prev), iVar1 != 0)) ||
           (iVar1 = Gia_ObjIsBuf(_Prev), iVar1 != 0)) {
          fprintf(__stream,"Node%d",(ulong)local_40);
          fprintf(__stream," -> ");
          uVar2 = Gia_ObjFaninId0(_Prev,local_40);
          fprintf(__stream,"Node%d",(ulong)uVar2);
          fprintf(__stream," [");
          iVar1 = Gia_ObjFaninC0(_Prev);
          pcVar5 = "solid";
          if (iVar1 != 0) {
            pcVar5 = "dotted";
          }
          fprintf(__stream,"style = %s",pcVar5);
          fprintf(__stream,"]");
          fprintf(__stream,";\n");
          iVar1 = Gia_ObjIsAnd(_Prev);
          if (iVar1 != 0) {
            fprintf(__stream,"Node%d",(ulong)local_40);
            fprintf(__stream," -> ");
            uVar2 = Gia_ObjFaninId1(_Prev,local_40);
            fprintf(__stream,"Node%d",(ulong)uVar2);
            fprintf(__stream," [");
            iVar1 = Gia_ObjFaninC1(_Prev);
            pcVar5 = "solid";
            if (iVar1 != 0) {
              pcVar5 = "dotted";
            }
            fprintf(__stream,"style = %s",pcVar5);
            fprintf(__stream,"]");
            fprintf(__stream,";\n");
            iVar1 = Gia_ObjIsMux(p,_Prev);
            if (iVar1 != 0) {
              fprintf(__stream,"Node%d",(ulong)local_40);
              fprintf(__stream," -> ");
              uVar2 = Gia_ObjFaninId2(p,local_40);
              fprintf(__stream,"Node%d",(ulong)uVar2);
              fprintf(__stream," [");
              iVar1 = Gia_ObjFaninC2(p,_Prev);
              pcVar5 = "bold";
              if (iVar1 != 0) {
                pcVar5 = "dotted";
              }
              fprintf(__stream,"style = %s",pcVar5);
              fprintf(__stream,"]");
              fprintf(__stream,";\n");
            }
          }
        }
        local_40 = local_40 + 1;
      }
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fclose(__stream);
      if (vBold == (Vec_Int_t *)0x0) {
        if ((p->nXors != 0) || (p->nMuxes != 0)) {
          Gia_ManCleanMark0(p);
        }
      }
      else {
        local_40 = 0;
        while( true ) {
          iVar1 = Vec_IntSize(vBold);
          bVar7 = false;
          if ((int)local_40 < iVar1) {
            iVar1 = Vec_IntEntry(vBold,local_40);
            _Prev = Gia_ManObj(p,iVar1);
            bVar7 = _Prev != (Gia_Obj_t *)0x0;
          }
          if (!bVar7) break;
          *(ulong *)_Prev = *(ulong *)_Prev & 0xffffffffbfffffff;
          local_40 = local_40 + 1;
        }
      }
      Vec_IntFreeP(&p->vLevels);
    }
  }
  else {
    fprintf(_stdout,"Cannot visualize AIG with more than %d nodes.\n",2000);
  }
  return;
}

Assistant:

void Gia_WriteDotAigSimple( Gia_Man_t * p, char * pFileName, Vec_Int_t * vBold )
{
    FILE * pFile;
    Gia_Obj_t * pNode;//, * pTemp, * pPrev;
    int LevelMax, Prev, Level, i;
    int fConstIsUsed = 0;

    if ( Gia_ManAndNum(p) > NODE_MAX )
    {
        fprintf( stdout, "Cannot visualize AIG with more than %d nodes.\n", NODE_MAX );
        return;
    }
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // mark the nodes
    if ( vBold )
        Gia_ManForEachObjVec( vBold, p, pNode, i )
            pNode->fMark0 = 1;
    else if ( p->nXors || p->nMuxes )
        Gia_ManForEachObj( p, pNode, i )
            if ( Gia_ObjIsXor(pNode) || Gia_ObjIsMux(p, pNode) )
                pNode->fMark0 = 1;

    // compute levels
    LevelMax = 1 + Gia_ManLevelNum( p );
    Gia_ManForEachCo( p, pNode, i )
        Vec_IntWriteEntry( p->vLevels, Gia_ObjId(p, pNode), LevelMax );

    // write the DOT header
    fprintf( pFile, "# %s\n",  "AIG structure generated by GIA package" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph AIG {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//  fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != 0 )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "AIG structure visualized by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\". ", "aig" );
//    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "The AIG contains %d nodes and spans %d levels.", Gia_ManAndNum(p), LevelMax-1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the COs
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  LevelMax );
    // generate the CO nodes
    Gia_ManForEachCo( p, pNode, i )
    {
        if ( Gia_ObjFaninId0p(p, pNode) == 0 )
            fConstIsUsed = 1;
/*
        if ( fHaig || pNode->pEquiv == NULL )
            fprintf( pFile, "  Node%d%s [label = \"%d%s\"", pNode->Id, 
                (Gia_ObjIsLatch(pNode)? "_in":""), pNode->Id, (Gia_ObjIsLatch(pNode)? "_in":"") );
        else
            fprintf( pFile, "  Node%d%s [label = \"%d%s(%d%s)\"", pNode->Id, 
                (Gia_ObjIsLatch(pNode)? "_in":""), pNode->Id, (Gia_ObjIsLatch(pNode)? "_in":""), 
                    Gia_Regular(pNode->pEquiv)->Id, Gia_IsComplement(pNode->pEquiv)? "\'":"" );
*/
        fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 

        fprintf( pFile, ", shape = %s", "invtriangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate nodes of each rank
    for ( Level = LevelMax - 1; Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Gia_ManForEachObj( p, pNode, i )
        {
            if ( (int)Gia_ObjLevel(p, pNode) != Level )
                continue;
/*
            if ( fHaig || pNode->pEquiv == NULL )
                fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id );
            else 
                fprintf( pFile, "  Node%d [label = \"%d(%d%s)\"", pNode->Id, pNode->Id, 
                    Gia_Regular(pNode->pEquiv)->Id, Gia_IsComplement(pNode->pEquiv)? "\'":"" );
*/
            fprintf( pFile, "  Node%d [label = \"%d\"", i, i ); 

            if ( Gia_ObjIsXor(pNode) )
                fprintf( pFile, ", shape = doublecircle" );
            else if ( Gia_ObjIsMux(p, pNode) )
                fprintf( pFile, ", shape = trapezium" );
            else
                fprintf( pFile, ", shape = ellipse" );

            if ( pNode->fMark0 )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the CI nodes
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  0 );
    // generate constant node
    if ( fConstIsUsed )
    {
        // check if the costant node is present
        fprintf( pFile, "  Node%d [label = \"Const0\"", 0 );
        fprintf( pFile, ", shape = ellipse" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    // generate the CI nodes
    Gia_ManForEachCi( p, pNode, i )
    {
/*
        if ( fHaig || pNode->pEquiv == NULL )
            fprintf( pFile, "  Node%d%s [label = \"%d%s\"", pNode->Id, 
                (Gia_ObjIsLatch(pNode)? "_out":""), pNode->Id, (Gia_ObjIsLatch(pNode)? "_out":"") );
        else
            fprintf( pFile, "  Node%d%s [label = \"%d%s(%d%s)\"", pNode->Id, 
                (Gia_ObjIsLatch(pNode)? "_out":""), pNode->Id, (Gia_ObjIsLatch(pNode)? "_out":""), 
                    Gia_Regular(pNode->pEquiv)->Id, Gia_IsComplement(pNode->pEquiv)? "\'":"" );
*/
        fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 

        fprintf( pFile, ", shape = %s", "triangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Gia_ManForEachCo( p, pNode, i )
        fprintf( pFile, "title2 -> Node%d [style = invis];\n", Gia_ObjId(p, pNode) );
    // generate invisible edges among the COs
    Prev = -1;
    Gia_ManForEachCo( p, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Gia_ObjId(p, pNode) );
        Prev = Gia_ObjId(p, pNode);
    }
    // generate invisible edges among the CIs
    Prev = -1;
    Gia_ManForEachCi( p, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Gia_ObjId(p, pNode) );
        Prev = Gia_ObjId(p, pNode);
    }

    // generate edges
    Gia_ManForEachObj( p, pNode, i )
    {
        if ( !Gia_ObjIsAnd(pNode) && !Gia_ObjIsCo(pNode) && !Gia_ObjIsBuf(pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  i );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ObjFaninId0(pNode, i) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC0(pNode)? "dotted" : "solid" );
//        if ( Gia_NtkIsSeq(pNode->p) && Seq_ObjFaninL0(pNode) > 0 )
//        fprintf( pFile, ", label = \"%s\"", Seq_ObjFaninGetInitPrintable(pNode,0) );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
        if ( !Gia_ObjIsAnd(pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  i );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ObjFaninId1(pNode, i) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC1(pNode)? "dotted" : "solid" );
//        if ( Gia_NtkIsSeq(pNode->p) && Seq_ObjFaninL1(pNode) > 0 )
//        fprintf( pFile, ", label = \"%s\"", Seq_ObjFaninGetInitPrintable(pNode,1) );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );

        if ( !Gia_ObjIsMux(p, pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  i );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ObjFaninId2(p, i) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC2(p, pNode)? "dotted" : "bold" );
//        if ( Gia_NtkIsSeq(pNode->p) && Seq_ObjFaninL1(pNode) > 0 )
//        fprintf( pFile, ", label = \"%s\"", Seq_ObjFaninGetInitPrintable(pNode,1) );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );

/*
        // generate the edges between the equivalent nodes
        if ( fHaig && pNode->pEquiv && Gia_ObjRefs(pNode) > 0 )
        {
            pPrev = pNode;
            for ( pTemp = pNode->pEquiv; pTemp != pNode; pTemp = Gia_Regular(pTemp->pEquiv) )
            {
                fprintf( pFile, "Node%d",  pPrev->Id );
                fprintf( pFile, " -> " );
                fprintf( pFile, "Node%d",  pTemp->Id );
                fprintf( pFile, " [style = %s]", Gia_IsComplement(pTemp->pEquiv)? "dotted" : "solid" );
                fprintf( pFile, ";\n" );
                pPrev = pTemp;
            }
            // connect the last node with the first
            fprintf( pFile, "Node%d",  pPrev->Id );
            fprintf( pFile, " -> " );
            fprintf( pFile, "Node%d",  pNode->Id );
            fprintf( pFile, " [style = %s]", Gia_IsComplement(pPrev->pEquiv)? "dotted" : "solid" );
            fprintf( pFile, ";\n" );
        }
*/
    }

    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark nodes
    if ( vBold )
        Gia_ManForEachObjVec( vBold, p, pNode, i )
            pNode->fMark0 = 0;
    else if ( p->nXors || p->nMuxes )
        Gia_ManCleanMark0( p );

    Vec_IntFreeP( &p->vLevels );
}